

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O3

ze_result_t
driver::zesDriverGetDeviceByUuidExp
          (zes_driver_handle_t hDriver,zes_uuid_t uuid,zes_device_handle_t *phDevice,
          ze_bool_t *onSubdevice,uint32_t *subdeviceId)

{
  ze_result_t zVar1;
  
  if (DAT_0010eac8 != (code *)0x0) {
    zVar1 = (*DAT_0010eac8)(hDriver,uuid.id._0_8_,uuid.id._8_8_);
    return zVar1;
  }
  context_t::get()::count = (zes_device_handle_t)((long)context_t::get()::count + 1);
  *phDevice = context_t::get()::count;
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDriverGetDeviceByUuidExp(
        zes_driver_handle_t hDriver,                    ///< [in] handle of the sysman driver instance
        zes_uuid_t uuid,                                ///< [in] universal unique identifier.
        zes_device_handle_t* phDevice,                  ///< [out] Sysman handle of the device.
        ze_bool_t* onSubdevice,                         ///< [out] True if the UUID belongs to the sub-device; false means that
                                                        ///< UUID belongs to the root device.
        uint32_t* subdeviceId                           ///< [out] If onSubdevice is true, this gives the ID of the sub-device
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetDeviceByUuidExp = context.zesDdiTable.DriverExp.pfnGetDeviceByUuidExp;
        if( nullptr != pfnGetDeviceByUuidExp )
        {
            result = pfnGetDeviceByUuidExp( hDriver, uuid, phDevice, onSubdevice, subdeviceId );
        }
        else
        {
            // generic implementation
            *phDevice = reinterpret_cast<zes_device_handle_t>( context.get() );

        }

        return result;
    }